

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
optTyped_valueConstructor1_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::
~optTyped_valueConstructor1_Test
          (optTyped_valueConstructor1_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_> *this)

{
  optTyped_valueConstructor1_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_> *this_local;
  
  ~optTyped_valueConstructor1_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TYPED_TEST(optTyped, valueConstructor1)
{
  using opt_type = typename TestFixture::type;
  opt_type o{this->value_1};
  EXPECT_TRUE(o);
  EXPECT_TRUE(o.has_value());
  EXPECT_EQ(this->value_1, *o);
  EXPECT_EQ(this->value_1, o.value());
  EXPECT_EQ(this->value_1, o.value_or(this->value_2));

  const opt_type& co{o};
  EXPECT_TRUE(co);
  EXPECT_TRUE(co.has_value());
  EXPECT_EQ(this->value_1, *co);
  EXPECT_EQ(this->value_1, co.value());
  EXPECT_EQ(this->value_1, co.value_or(this->value_2));
}